

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

bool __thiscall calculator::ExpressionParser<__int128>::isHex(ExpressionParser<__int128> *this)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  __int128 *p_Var4;
  long extraout_RDX;
  char in_SIL;
  
  uVar1 = this->index_ + 2;
  if (uVar1 < (this->expr_)._M_string_length) {
    pcVar2 = (this->expr_)._M_dataplus._M_p;
    iVar3 = tolower((int)pcVar2[this->index_ + 1]);
    if (iVar3 == 0x78) {
      p_Var4 = toInteger((__int128 *)(ulong)(uint)(int)pcVar2[uVar1],in_SIL);
      return extraout_RDX < (long)(ulong)(p_Var4 < (__int128 *)0x10);
    }
  }
  return false;
}

Assistant:

bool isHex() const
  {
    if (index_ + 2 < expr_.size())
    {
      char x = expr_[index_ + 1];
      char h = expr_[index_ + 2];
      return (std::tolower(x) == 'x' && toInteger(h) <= 0xf);
    }
    return false;
  }